

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_resolver_util_test.cc
# Opt level: O1

bool google::protobuf::util::anon_unknown_0::CheckFieldTypeUrl
               (Type *type,string_view name,string_view type_url)

{
  char *__n;
  int iVar1;
  Field *pFVar2;
  undefined8 *puVar3;
  string_view name_00;
  
  name_00._M_str = (char *)type_url._M_len;
  name_00._M_len = name._M_str;
  pFVar2 = FindField((anon_unknown_0 *)type,(Type *)name._M_len,name_00);
  if (pFVar2 != (Field *)0x0) {
    puVar3 = (undefined8 *)
             ((ulong)(pFVar2->field_0)._impl_.type_url_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
    __n = (char *)puVar3[1];
    if (__n == name_00._M_str) {
      if (__n != (char *)0x0) {
        iVar1 = bcmp((void *)*puVar3,type_url._M_str,(size_t)__n);
        return iVar1 == 0;
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool CheckFieldTypeUrl(const Type& type, absl::string_view name,
                       absl::string_view type_url) {
  const Field* field = FindField(type, name);
  if (field == nullptr) {
    return false;
  }
  return field->type_url() == type_url;
}